

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctr_drbg.c
# Opt level: O2

int block_cipher_df(uchar *output,uchar *data,size_t data_len)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  uchar *puVar5;
  bool bVar6;
  uchar chain [16];
  uchar key [32];
  uchar tmp [48];
  mbedtls_aes_context aes_ctx;
  uchar buf [416];
  
  if (data_len < 0x181) {
    memset(buf,0,0x1a0);
    mbedtls_aes_init(&aes_ctx);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = (uchar)(data_len >> 8);
    buf[0x13] = (uchar)data_len;
    buf[0x17] = '0';
    memcpy(buf + 0x18,data,data_len);
    buf[data_len + 0x18] = 0x80;
    for (lVar4 = 0; lVar4 != 0x20; lVar4 = lVar4 + 1) {
      key[lVar4] = (uchar)lVar4;
    }
    iVar1 = mbedtls_aes_setkey_enc(&aes_ctx,key,0x100);
    if (iVar1 == 0) {
      for (uVar2 = 0; uVar2 < 0x30; uVar2 = uVar2 + 0x10) {
        chain[0] = '\0';
        chain[1] = '\0';
        chain[2] = '\0';
        chain[3] = '\0';
        chain[4] = '\0';
        chain[5] = '\0';
        chain[6] = '\0';
        chain[7] = '\0';
        chain[8] = '\0';
        chain[9] = '\0';
        chain[10] = '\0';
        chain[0xb] = '\0';
        chain[0xc] = '\0';
        chain[0xd] = '\0';
        chain[0xe] = '\0';
        chain[0xf] = '\0';
        puVar5 = buf;
        uVar3 = data_len + 0x19;
        while (uVar3 != 0) {
          for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
            chain[lVar4] = chain[lVar4] ^ puVar5[lVar4];
          }
          puVar5 = puVar5 + 0x10;
          bVar6 = uVar3 < 0x10;
          uVar3 = uVar3 - 0x10;
          if (bVar6) {
            uVar3 = 0;
          }
          iVar1 = mbedtls_aes_crypt_ecb(&aes_ctx,1,chain,chain);
          if (iVar1 != 0) goto LAB_001081b4;
        }
        *(undefined8 *)(tmp + uVar2) = chain._0_8_;
        *(undefined8 *)(tmp + uVar2 + 8) = chain._8_8_;
        buf[3] = buf[3] + '\x01';
      }
      iVar1 = mbedtls_aes_setkey_enc(&aes_ctx,tmp,0x100);
      if (iVar1 == 0) {
        lVar4 = 0;
        while ((iVar1 = 0, (uint)lVar4 < 0x30 &&
               (iVar1 = mbedtls_aes_crypt_ecb(&aes_ctx,1,tmp + 0x20,tmp + 0x20), iVar1 == 0))) {
          *(undefined8 *)(output + lVar4) = tmp._32_8_;
          *(undefined8 *)(output + lVar4 + 8) = tmp._40_8_;
          lVar4 = lVar4 + 0x10;
        }
      }
    }
LAB_001081b4:
    mbedtls_aes_free(&aes_ctx);
    mbedtls_platform_zeroize(buf,0x1a0);
    mbedtls_platform_zeroize(tmp,0x30);
    mbedtls_platform_zeroize(key,0x20);
    mbedtls_platform_zeroize(chain,0x10);
    if (iVar1 == 0) {
      iVar1 = 0;
    }
    else {
      mbedtls_platform_zeroize(output,0x30);
    }
  }
  else {
    iVar1 = -0x38;
  }
  return iVar1;
}

Assistant:

static int block_cipher_df( unsigned char *output,
                            const unsigned char *data, size_t data_len )
{
    unsigned char buf[MBEDTLS_CTR_DRBG_MAX_SEED_INPUT +
                      MBEDTLS_CTR_DRBG_BLOCKSIZE + 16];
    unsigned char tmp[MBEDTLS_CTR_DRBG_SEEDLEN];
    unsigned char key[MBEDTLS_CTR_DRBG_KEYSIZE];
    unsigned char chain[MBEDTLS_CTR_DRBG_BLOCKSIZE];
    unsigned char *p, *iv;
    mbedtls_aes_context aes_ctx;
    int ret = 0;

    int i, j;
    size_t buf_len, use_len;

    if( data_len > MBEDTLS_CTR_DRBG_MAX_SEED_INPUT )
        return( MBEDTLS_ERR_CTR_DRBG_INPUT_TOO_BIG );

    memset( buf, 0, MBEDTLS_CTR_DRBG_MAX_SEED_INPUT +
            MBEDTLS_CTR_DRBG_BLOCKSIZE + 16 );
    mbedtls_aes_init( &aes_ctx );

    /*
     * Construct IV (16 bytes) and S in buffer
     * IV = Counter (in 32-bits) padded to 16 with zeroes
     * S = Length input string (in 32-bits) || Length of output (in 32-bits) ||
     *     data || 0x80
     *     (Total is padded to a multiple of 16-bytes with zeroes)
     */
    p = buf + MBEDTLS_CTR_DRBG_BLOCKSIZE;
    *p++ = ( data_len >> 24 ) & 0xff;
    *p++ = ( data_len >> 16 ) & 0xff;
    *p++ = ( data_len >> 8  ) & 0xff;
    *p++ = ( data_len       ) & 0xff;
    p += 3;
    *p++ = MBEDTLS_CTR_DRBG_SEEDLEN;
    memcpy( p, data, data_len );
    p[data_len] = 0x80;

    buf_len = MBEDTLS_CTR_DRBG_BLOCKSIZE + 8 + data_len + 1;

    for( i = 0; i < MBEDTLS_CTR_DRBG_KEYSIZE; i++ )
        key[i] = i;

    if( ( ret = mbedtls_aes_setkey_enc( &aes_ctx, key,
                                        MBEDTLS_CTR_DRBG_KEYBITS ) ) != 0 )
    {
        goto exit;
    }

    /*
     * Reduce data to MBEDTLS_CTR_DRBG_SEEDLEN bytes of data
     */
    for( j = 0; j < MBEDTLS_CTR_DRBG_SEEDLEN; j += MBEDTLS_CTR_DRBG_BLOCKSIZE )
    {
        p = buf;
        memset( chain, 0, MBEDTLS_CTR_DRBG_BLOCKSIZE );
        use_len = buf_len;

        while( use_len > 0 )
        {
            for( i = 0; i < MBEDTLS_CTR_DRBG_BLOCKSIZE; i++ )
                chain[i] ^= p[i];
            p += MBEDTLS_CTR_DRBG_BLOCKSIZE;
            use_len -= ( use_len >= MBEDTLS_CTR_DRBG_BLOCKSIZE ) ?
                       MBEDTLS_CTR_DRBG_BLOCKSIZE : use_len;

            if( ( ret = mbedtls_aes_crypt_ecb( &aes_ctx, MBEDTLS_AES_ENCRYPT,
                                               chain, chain ) ) != 0 )
            {
                goto exit;
            }
        }

        memcpy( tmp + j, chain, MBEDTLS_CTR_DRBG_BLOCKSIZE );

        /*
         * Update IV
         */
        buf[3]++;
    }

    /*
     * Do final encryption with reduced data
     */
    if( ( ret = mbedtls_aes_setkey_enc( &aes_ctx, tmp,
                                        MBEDTLS_CTR_DRBG_KEYBITS ) ) != 0 )
    {
        goto exit;
    }
    iv = tmp + MBEDTLS_CTR_DRBG_KEYSIZE;
    p = output;

    for( j = 0; j < MBEDTLS_CTR_DRBG_SEEDLEN; j += MBEDTLS_CTR_DRBG_BLOCKSIZE )
    {
        if( ( ret = mbedtls_aes_crypt_ecb( &aes_ctx, MBEDTLS_AES_ENCRYPT,
                                           iv, iv ) ) != 0 )
        {
            goto exit;
        }
        memcpy( p, iv, MBEDTLS_CTR_DRBG_BLOCKSIZE );
        p += MBEDTLS_CTR_DRBG_BLOCKSIZE;
    }
exit:
    mbedtls_aes_free( &aes_ctx );
    /*
    * tidy up the stack
    */
    mbedtls_platform_zeroize( buf, sizeof( buf ) );
    mbedtls_platform_zeroize( tmp, sizeof( tmp ) );
    mbedtls_platform_zeroize( key, sizeof( key ) );
    mbedtls_platform_zeroize( chain, sizeof( chain ) );
    if( 0 != ret )
    {
        /*
        * wipe partial seed from memory
        */
        mbedtls_platform_zeroize( output, MBEDTLS_CTR_DRBG_SEEDLEN );
    }

    return( ret );
}